

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O0

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::SelectCoins
          (CoinSelection *this,Amount *target_value,
          vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *utxos,UtxoFilter *filter,
          CoinSelectionOption *option_params,Amount *tx_fee_value,Amount *select_value,
          Amount *utxo_fee_value,bool *searched_bnb)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RCX;
  Amount *in_RDX;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RDI;
  int64_t *in_stack_00000010;
  int64_t *in_stack_00000018;
  byte *in_stack_00000020;
  int64_t select_satoshi;
  bool consider_fee;
  bool use_bnb_out;
  Amount utxo_fee_out;
  Utxo *utxo_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__range1_1;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> p_utxos;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> work_utxos;
  bool in_stack_00000157;
  CoinSelectionOption *in_stack_00000158;
  UtxoFilter *in_stack_00000160;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *in_stack_00000168;
  int64_t *in_stack_00000170;
  CoinSelection *in_stack_00000178;
  Amount *in_stack_00000190;
  Utxo *utxo;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__range1;
  uint8_t src [33];
  bool first;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *result;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  string *in_stack_fffffffffffffe00;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *this_00;
  undefined8 in_stack_fffffffffffffe08;
  CfdError CVar4;
  CfdException *in_stack_fffffffffffffe10;
  undefined1 *__n;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *in_stack_fffffffffffffe20;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffe38;
  char *pcVar5;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffe40;
  allocator *paVar6;
  Amount local_1a0;
  int64_t local_190;
  undefined1 local_181;
  int64_t local_180;
  undefined1 local_172;
  byte local_171;
  undefined1 local_170 [16];
  reference local_160;
  reference local_158;
  Utxo *local_150;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_148;
  undefined1 *local_140;
  undefined1 local_138 [24];
  undefined1 local_120 [30];
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c5;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  reference local_78;
  Utxo *local_70;
  __normal_iterator<const_cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
  local_68 [2];
  undefined1 local_58 [39];
  byte local_31;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *local_20;
  Amount *local_18;
  
  local_31 = 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_68[0]._M_current =
       (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin(in_stack_fffffffffffffde8);
  local_70 = (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::end
                               (in_stack_fffffffffffffde8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                        *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                       (__normal_iterator<const_cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                        *)in_stack_fffffffffffffde8);
    CVar4 = (CfdError)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    if (!bVar1) {
      if (in_stack_00000010 == (int64_t *)0x0) {
        local_e0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_utxo.cpp"
                     ,0x2f);
        local_e0.filename = local_e0.filename + 1;
        local_e0.line = 0x112;
        local_e0.funcname = "SelectCoins";
        core::logger::warn<>(&local_e0,"Outparameter(select_value) is nullptr.");
        local_102 = 1;
        uVar3 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_100,"Failed to select coin. Outparameter is nullptr.",&local_101);
        core::CfdException::CfdException(in_stack_fffffffffffffe10,CVar4,in_stack_fffffffffffffe00);
        local_102 = 0;
        __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      __n = local_138;
      std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::vector
                ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)0x52cdfd);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(local_20);
      std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::reserve
                (in_stack_fffffffffffffe20,(size_type)__n);
      local_140 = local_120;
      local_148._M_current =
           (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                             (in_stack_fffffffffffffde8);
      local_150 = (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::end
                                    (in_stack_fffffffffffffde8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                (__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                                 *)in_stack_fffffffffffffde8), bVar1) {
        local_160 = __gnu_cxx::
                    __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                    ::operator*(&local_148);
        local_158 = local_160;
        std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::push_back
                  ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   (value_type *)in_stack_fffffffffffffde8);
        __gnu_cxx::
        __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
        operator++(&local_148);
      }
      core::Amount::Amount((Amount *)local_170);
      local_171 = 0;
      local_172 = 1;
      local_180 = 0;
      local_181 = 0;
      local_190 = core::Amount::GetSatoshiValue(local_18);
      this_00 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_170;
      SelectCoinsMinConf(in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160,
                         in_stack_00000158,in_stack_00000190,in_stack_00000157,(int64_t *)utxo,
                         (Amount *)__end1._M_current,(bool *)__begin1._M_current);
      if (in_stack_00000018 != (int64_t *)0x0) {
        *in_stack_00000018 = local_170._0_8_;
        *(bool *)(in_stack_00000018 + 1) = local_170[8];
      }
      if (in_stack_00000020 != (byte *)0x0) {
        *in_stack_00000020 = local_171 & 1;
      }
      core::Amount::Amount(&local_1a0,local_180);
      *in_stack_00000010 = local_1a0.amount_;
      *(bool *)(in_stack_00000010 + 1) = local_1a0.ignore_check_;
      local_181 = 1;
      std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::~vector
                ((vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *)this_00);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(this_00);
      return in_RDI;
    }
    local_78 = __gnu_cxx::
               __normal_iterator<const_cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
               ::operator*(local_68);
    if ((local_31 & 1) == 0) {
      iVar2 = memcmp(local_78->asset,local_58,0x21);
      CVar4 = (CfdError)((ulong)in_stack_fffffffffffffe08 >> 0x20);
      if (iVar2 != 0) {
        local_90.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_utxo.cpp"
                     ,0x2f);
        local_90.filename = local_90.filename + 1;
        local_90.line = 0x109;
        local_90.funcname = "SelectCoins";
        pcVar5 = "Failed to SelectCoins. Exists multiple assets in utxo list.";
        core::logger::warn<>
                  (&local_90,"Failed to SelectCoins. Exists multiple assets in utxo list.");
        local_c5 = 1;
        uVar3 = __cxa_allocate_exception(0x30);
        paVar6 = &local_b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b0,pcVar5,paVar6);
        core::CfdException::CfdException(in_stack_fffffffffffffe10,CVar4,in_stack_fffffffffffffe00);
        local_c5 = 0;
        __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
    }
    else {
      memcpy(local_58,local_78->asset,0x21);
      local_31 = 0;
    }
    __gnu_cxx::
    __normal_iterator<const_cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++(local_68);
  } while( true );
}

Assistant:

std::vector<Utxo> CoinSelection::SelectCoins(
    const Amount& target_value, const std::vector<Utxo>& utxos,
    const UtxoFilter& filter, const CoinSelectionOption& option_params,
    const Amount& tx_fee_value, Amount* select_value, Amount* utxo_fee_value,
    bool* searched_bnb) {
#ifndef CFD_DISABLE_ELEMENTS
  bool first = true;
  uint8_t src[33];
  for (auto& utxo : utxos) {
    if (first) {
      memcpy(src, utxo.asset, sizeof(src));
      first = false;
    } else if (memcmp(utxo.asset, src, sizeof(src)) != 0) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to SelectCoins. Exists multiple assets in utxo list.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to SelectCoins. Exists multiple assets in utxo list.");
    }
  }
#endif
  if (select_value == nullptr) {
    warn(CFD_LOG_SOURCE, "Outparameter(select_value) is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to select coin. Outparameter is nullptr.");
  }

  // convert utxo list
  std::vector<Utxo> work_utxos = utxos;
  std::vector<Utxo*> p_utxos;
  p_utxos.reserve(utxos.size());
  for (auto& utxo : work_utxos) {
    p_utxos.push_back(&utxo);
  }

  // initialize output parameter
  Amount utxo_fee_out = Amount();
  bool use_bnb_out = false;
  const bool consider_fee = true;
  int64_t select_satoshi = 0;
  std::vector<Utxo> result = SelectCoinsMinConf(
      target_value.GetSatoshiValue(), p_utxos, filter, option_params,
      tx_fee_value, consider_fee, &select_satoshi, &utxo_fee_out,
      &use_bnb_out);
  if (utxo_fee_value != nullptr) {
    *utxo_fee_value = utxo_fee_out;
  }
  if (searched_bnb != nullptr) {
    *searched_bnb = use_bnb_out;
  }
  *select_value = Amount(select_satoshi);

  return result;
}